

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.h
# Opt level: O2

void IntsToStr(int *pInts,int Num,char *pStr)

{
  long lVar1;
  
  for (lVar1 = 0; Num != (int)lVar1; lVar1 = lVar1 + 1) {
    pStr[lVar1 * 4] = *(char *)((long)pInts + lVar1 * 4 + 3) + -0x80;
    pStr[lVar1 * 4 + 1] = *(char *)((long)pInts + lVar1 * 4 + 2) + -0x80;
    pStr[lVar1 * 4 + 2] = *(char *)((long)pInts + lVar1 * 4 + 1) + -0x80;
    pStr[lVar1 * 4 + 3] = (char)pInts[lVar1] + -0x80;
  }
  pStr[lVar1 * 4 + -1] = '\0';
  return;
}

Assistant:

inline void IntsToStr(const int *pInts, int Num, char *pStr)
{
	while(Num)
	{
		pStr[0] = (((*pInts)>>24)&0xff)-128;
		pStr[1] = (((*pInts)>>16)&0xff)-128;
		pStr[2] = (((*pInts)>>8)&0xff)-128;
		pStr[3] = ((*pInts)&0xff)-128;
		pStr += 4;
		pInts++;
		Num--;
	}

	// null terminate
	pStr[-1] = 0;
}